

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

int __thiscall
JsUtil::
BaseDictionary<Js::EvalMapStringInternal<true>,Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,Js::ScriptFunction*,JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,Js::ScriptFunction*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>,Js::EvalMapStringInternal<false>>*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,Js::FastEvalMapStringComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::FindEntryWithKey<Js::EvalMapStringInternal<true>>
          (BaseDictionary<Js::EvalMapStringInternal<true>,Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,Js::ScriptFunction*,JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,Js::ScriptFunction*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>,Js::EvalMapStringInternal<false>>*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,Js::FastEvalMapStringComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,EvalMapStringInternal<true> *key)

{
  undefined8 *puVar1;
  long lVar2;
  undefined8 uVar3;
  char16_t *pcVar4;
  hash_t hVar5;
  uint uVar6;
  uint depth;
  long lVar7;
  char16_t *local_98 [2];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined4 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  hash_t *local_50;
  EvalMapStringInternal<true> *local_48;
  BaseDictionary<Js::EvalMapStringInternal<true>,Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,Js::ScriptFunction*,JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,Js::ScriptFunction*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>,Js::EvalMapStringInternal<false>>*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,Js::FastEvalMapStringComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  *local_40;
  uint local_34;
  
  lVar2 = *(long *)this;
  depth = 0;
  local_40 = this;
  if (lVar2 != 0) {
    local_48 = key;
    hVar5 = GetHashCodeWithKey<Js::EvalMapStringInternal<true>>(key);
    hVar5 = PrimePolicy::ModPrime(hVar5 >> 1,*(uint *)(this + 0x1c),*(int *)(this + 0x2c));
    uVar6 = *(uint *)(lVar2 + (ulong)hVar5 * 4);
    depth = 0;
    if (-1 < (int)uVar6) {
      lVar2 = *(long *)(local_40 + 8);
      local_50 = &local_48->hash;
      depth = 0;
      do {
        lVar7 = (ulong)uVar6 * 0x38;
        local_78 = *(undefined8 *)(lVar2 + 0x10 + lVar7);
        uVar3 = *(undefined8 *)(lVar2 + 0x18 + lVar7);
        local_34 = uVar6;
        Memory::Recycler::WBSetBit((char *)&local_70);
        local_70 = uVar3;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_70);
        local_68 = *(undefined4 *)(lVar2 + 0x20 + lVar7);
        puVar1 = (undefined8 *)(lVar2 + 0x28 + lVar7);
        local_60 = *puVar1;
        uStack_58 = puVar1[1];
        pcVar4 = (local_48->str).string.ptr;
        Memory::Recycler::WBSetBit((char *)local_98);
        local_98[0] = pcVar4;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(local_98);
        uVar3 = *(undefined8 *)local_50;
        uStack_80 = *(undefined8 *)(local_50 + 2);
        local_88._0_4_ = (int)uVar3;
        local_88 = uVar3;
        if ((int)local_60 == (int)local_88) {
          local_88._4_4_ = (int)((ulong)uVar3 >> 0x20);
          if (local_60._4_4_ == local_88._4_4_) {
            if ((int)uStack_58 == (int)uStack_80) {
              if (*(DictionaryStats **)(local_40 + 0x30) == (DictionaryStats *)0x0) {
                return local_34;
              }
              DictionaryStats::Lookup(*(DictionaryStats **)(local_40 + 0x30),depth);
              return local_34;
            }
          }
        }
        depth = depth + 1;
        uVar6 = *(uint *)(lVar7 + lVar2 + 8);
      } while (-1 < (int)uVar6);
    }
  }
  if (*(DictionaryStats **)(local_40 + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(local_40 + 0x30),depth);
  }
  return -1;
}

Assistant:

inline int FindEntryWithKey(const LookupType& key) const
        {
#if PROFILE_DICTIONARY
            uint depth = 0;
#endif
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                uint targetBucket = this->GetBucket(hashCode);
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        return i;
                    }

#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }
            }

#if PROFILE_DICTIONARY
            if (stats)
                stats->Lookup(depth);
#endif
            return -1;
        }